

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O0

int pt_blk_fetch_event(pt_block_decoder *decoder)

{
  int iVar1;
  int errcode;
  pt_event *ev;
  pt_block_decoder *decoder_local;
  
  if (decoder == (pt_block_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    decoder->tsc = (decoder->event).tsc;
    *(ushort *)&decoder->field_0xa74 =
         *(ushort *)&decoder->field_0xa74 & 0xfffb |
         (ushort)((byte)(decoder->event).field_0x4 >> 2 & 1) << 2;
    decoder->lost_mtc = (decoder->event).lost_mtc;
    decoder->lost_cyc = (decoder->event).lost_cyc;
    iVar1 = pt_evt_next(&decoder->evdec,&decoder->event,0x48);
    if (iVar1 < 0) {
      decoder->status = iVar1;
      memset(&decoder->event,0xff,0x48);
    }
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_blk_fetch_event(struct pt_block_decoder *decoder)
{
	struct pt_event *ev;
	int errcode;

	if (!decoder)
		return -pte_internal;

	ev = &decoder->event;
	decoder->tsc = ev->tsc;
	decoder->has_tsc = ev->has_tsc;
	decoder->lost_mtc = ev->lost_mtc;
	decoder->lost_cyc = ev->lost_cyc;

	errcode = pt_evt_next(&decoder->evdec, ev, sizeof(*ev));
	if (errcode < 0) {
		decoder->status = errcode;
		memset(ev, 0xff, sizeof(*ev));
	}

	return 0;
}